

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XGLLoader.cpp
# Opt level: O0

aiVector2D __thiscall Assimp::XGLImporter::ReadVec2(XGLImporter *this)

{
  aiVector2D aVar1;
  bool bVar2;
  element_type *peVar3;
  ai_real extraout_var;
  ai_real aVar4;
  int local_2c;
  float local_28;
  int i;
  ai_real v [2];
  char *s;
  XGLImporter *this_local;
  aiVector2D vec;
  
  aiVector2t<float>::aiVector2t((aiVector2t<float> *)&this_local);
  bVar2 = SkipToText(this);
  if (bVar2) {
    peVar3 = std::
             __shared_ptr_access<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->m_reader);
    v[0] = (ai_real)(*peVar3->_vptr_IIrrXMLReader[0xe])();
    v[1] = extraout_var;
    for (local_2c = 0; local_2c < 2; local_2c = local_2c + 1) {
      bVar2 = SkipSpaces<char>((char **)v);
      if (!bVar2) {
        LogFunctions<Assimp::XGLImporter>::LogError("unexpected EOL, failed to parse vec2");
        goto LAB_00953bb4;
      }
      aVar4 = fast_atof((char **)v);
      (&local_28)[local_2c] = aVar4;
      SkipSpaces<char>((char **)v);
      if ((local_2c != 1) && (*(char *)v != ',')) {
        LogFunctions<Assimp::XGLImporter>::LogError("expected comma, failed to parse vec2");
        goto LAB_00953bb4;
      }
      v = (ai_real  [2])((long)v + 1);
    }
    this_local._0_4_ = local_28;
    this_local._4_4_ = (float)i;
  }
  else {
    LogFunctions<Assimp::XGLImporter>::LogError("unexpected EOF reading vec2 contents");
  }
LAB_00953bb4:
  aVar1.y = this_local._4_4_;
  aVar1.x = this_local._0_4_;
  return aVar1;
}

Assistant:

aiVector2D XGLImporter::ReadVec2()
{
    aiVector2D vec;

    if(!SkipToText()) {
        LogError("unexpected EOF reading vec2 contents");
        return vec;
    }
    const char* s = m_reader->getNodeData();

    ai_real v[2];
	for(int i = 0; i < 2; ++i) {
        if(!SkipSpaces(&s)) {
            LogError("unexpected EOL, failed to parse vec2");
            return vec;
        }
		
        v[i] = fast_atof(&s);

        SkipSpaces(&s);
        if (i != 1 && *s != ',') {
            LogError("expected comma, failed to parse vec2");
            return vec;
        }
        ++s;
    }
	vec.x = v[0];
	vec.y = v[1];

    return vec;
}